

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void QMetaObjectPrivate::memberIndexes
               (QObject *obj,QMetaMethod *member,int *signalIndex,int *methodIndex)

{
  QMetaObject *pQVar1;
  uint *puVar2;
  int iVar3;
  MethodType MVar4;
  undefined4 extraout_var;
  int iVar5;
  bool bVar6;
  QMetaObject *mobj;
  
  *signalIndex = -1;
  *methodIndex = -1;
  if ((obj != (QObject *)0x0) && (member->mobj != (QMetaObject *)0x0)) {
    iVar3 = (**obj->_vptr_QObject)();
    mobj = (QMetaObject *)CONCAT44(extraout_var,iVar3);
    bVar6 = mobj == (QMetaObject *)0x0;
    if (mobj != member->mobj && !bVar6) {
      do {
        mobj = (mobj->d).superdata.direct;
        bVar6 = mobj == (QMetaObject *)0x0;
        if (bVar6) break;
      } while (mobj != member->mobj);
    }
    if (!bVar6) {
      iVar3 = QMetaMethod::relativeMethodIndex(member);
      *methodIndex = iVar3;
      *signalIndex = iVar3;
      iVar5 = 0;
      iVar3 = 0;
      for (pQVar1 = (mobj->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
          pQVar1 = (pQVar1->d).superdata.direct) {
        puVar2 = (pQVar1->d).data;
        iVar3 = iVar3 + puVar2[4];
        iVar5 = iVar5 + puVar2[0xd];
      }
      *methodIndex = *methodIndex + iVar3;
      MVar4 = QMetaMethod::methodType(member);
      iVar3 = -1;
      if (MVar4 == Signal) {
        iVar3 = originalClone(mobj,*signalIndex);
        iVar3 = iVar3 + iVar5;
      }
      *signalIndex = iVar3;
    }
  }
  return;
}

Assistant:

void QMetaObjectPrivate::memberIndexes(const QObject *obj,
                                       const QMetaMethod &member,
                                       int *signalIndex, int *methodIndex)
{
    *signalIndex = -1;
    *methodIndex = -1;
    if (!obj || !member.mobj)
        return;
    const QMetaObject *m = obj->metaObject();
    // Check that member is member of obj class
    while (m != nullptr && m != member.mobj)
        m = m->d.superdata;
    if (!m)
        return;
    *signalIndex = *methodIndex = member.relativeMethodIndex();

    int signalOffset;
    int methodOffset;
    computeOffsets(m, &signalOffset, &methodOffset);

    *methodIndex += methodOffset;
    if (member.methodType() == QMetaMethod::Signal) {
        *signalIndex = originalClone(m, *signalIndex);
        *signalIndex += signalOffset;
    } else {
        *signalIndex = -1;
    }
}